

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O1

char * GetLogString(LogMsgTy *l)

{
  int iVar1;
  size_t sVar2;
  string netwT;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&gLogMutex);
  if (iVar1 == 0) {
    NetwTimeString_abi_cxx11_(&netwT,l->netwTime);
    if ((int)l->lvl < 5) {
      snprintf(gBuf,0xfcf,"%s LiveTraffic %s %s:%d/%s: %s",netwT._M_dataplus._M_p,LOG_LEVEL[l->lvl],
               (l->fileName)._M_dataplus._M_p,(ulong)(uint)l->ln,(l->func)._M_dataplus._M_p,
               (l->msg)._M_dataplus._M_p);
    }
    else {
      snprintf(gBuf,0xfcf,"%s LiveTraffic: %s",netwT._M_dataplus._M_p,(l->msg)._M_dataplus._M_p);
    }
    sVar2 = strlen(gBuf);
    if (*(char *)((long)&gLogCnt + sVar2 + 7) != '\n') {
      (gBuf + sVar2)[0] = '\n';
      (gBuf + sVar2)[1] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)netwT._M_dataplus._M_p != &netwT.field_2) {
      operator_delete(netwT._M_dataplus._M_p,netwT.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gLogMutex);
    return gBuf;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const char* GetLogString (const LogMsgTy& l)
{
    // Access to static buffer and list guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Network time string
    const std::string netwT = NetwTimeString(l.netwTime);

    // prepare timestamp
    if (l.lvl < logMSG)                             // normal messages without, all other with location info
    {
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC " %s %s:%d/%s: %s",
                 netwT.c_str(),                     // network time (string)
                 LOG_LEVEL[l.lvl],                  // logging level
                 l.fileName.c_str(), l.ln,          // source file and line number
                 l.func.c_str(),                    // function name
                 l.msg.c_str());                    // actual message
    }
    else
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC ": %s",
                 netwT.c_str(),                     // network time (string)
                 l.msg.c_str());                    // actual message
    
    // ensure there's a trailing CR
    size_t sl = strlen(gBuf);
    if (gBuf[sl-1] != '\n')
    {
        gBuf[sl]   = '\n';
        gBuf[sl+1] = 0;
    }

    // return the static buffer
    return gBuf;
}